

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O2

h__Writer * __thiscall
AS_02::TimedText::MXFWriter::h__Writer::WriteAncillaryResource
          (h__Writer *this,FrameBuffer *FrameBuf,AESEncContext *Ctx,HMACContext *HMAC)

{
  int iVar1;
  ui64_t uVar2;
  undefined8 *puVar3;
  ILogSink *this_00;
  byte_t *pbVar4;
  value_type local_1e0 [4];
  undefined **local_178;
  undefined1 local_170;
  undefined8 local_16f;
  undefined8 uStack_167;
  UL local_158 [4];
  undefined4 local_d8;
  ui64_t local_d0;
  undefined8 local_c8;
  ui32_t local_98;
  undefined1 local_88;
  undefined8 local_87;
  undefined8 uStack_7f;
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  local_68 [56];
  
  if (*(int *)(FrameBuf + 10) == 3) {
    uVar2 = Kumu::IFileReader::TellPosition((IFileReader *)&FrameBuf->field_0x10);
    if (*(long *)&FrameBuf->field_0x8 == 0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                    ,0x25e,
                    "ASDCP::Result_t AS_02::TimedText::MXFWriter::h__Writer::WriteAncillaryResource(const ASDCP::TimedText::FrameBuffer &, ASDCP::AESEncContext *, ASDCP::HMACContext *)"
                   );
    }
    if (WriteAncillaryResource(ASDCP::TimedText::FrameBuffer_const&,ASDCP::AESEncContext*,ASDCP::HMACContext*)
        ::GenericStream_DataElement == '\0') {
      iVar1 = __cxa_guard_acquire(&WriteAncillaryResource(ASDCP::TimedText::FrameBuffer_const&,ASDCP::AESEncContext*,ASDCP::HMACContext*)
                                   ::GenericStream_DataElement);
      if (iVar1 != 0) {
        pbVar4 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)&FrameBuf->field_0x8);
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.m_HasValue = true;
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.m_Value._0_4_ =
             *(undefined4 *)pbVar4;
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.m_Value._4_4_ =
             *(undefined4 *)(pbVar4 + 4);
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.m_Value._8_4_ =
             *(undefined4 *)(pbVar4 + 8);
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.m_Value._12_4_ =
             *(undefined4 *)(pbVar4 + 0xc);
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.super_IArchive.
        _vptr_IArchive = (_func_int **)&PTR__IArchive_00168cc8;
        __cxa_guard_release(&WriteAncillaryResource(ASDCP::TimedText::FrameBuffer_const&,ASDCP::AESEncContext*,ASDCP::HMACContext*)
                             ::GenericStream_DataElement);
      }
    }
    ASDCP::MXF::Partition::Partition((Partition *)local_158,*(Dictionary **)&FrameBuf->field_0x8);
    local_d8 = *(undefined4 *)&FrameBuf[2].field_0x20;
    local_c8 = *(undefined8 *)(*(long *)(FrameBuf[8].m_AssetID + 8) + 0x20);
    local_1e0[0].BodySID = *(ui32_t *)&FrameBuf[0x12].m_MIMEType._M_dataplus._M_p;
    local_88 = FrameBuf[3].field_0x18;
    local_87 = *(undefined8 *)&FrameBuf[3].field_0x19;
    uStack_7f = *(undefined8 *)&FrameBuf[3].field_0x21;
    *(ui32_t *)&FrameBuf[0x12].m_MIMEType._M_dataplus._M_p = local_1e0[0].BodySID + 1;
    local_1e0[0].super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00168e48;
    local_1e0[0].ByteOffset = uVar2;
    local_d0 = uVar2;
    local_98 = local_1e0[0].BodySID;
    std::__cxx11::
    list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::push_back
              ((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                *)FrameBuf[8].m_AssetID,local_1e0);
    std::
    _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
    ::operator=(local_68,(_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                          *)&FrameBuf[3].m_MIMEType);
    puVar3 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)&FrameBuf->field_0x8);
    local_170 = 1;
    local_16f = *puVar3;
    uStack_167 = puVar3[1];
    local_178 = &PTR__IArchive_00168cc8;
    ASDCP::MXF::Partition::WriteToFile((FileWriter *)this,local_158);
    if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                      super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                      super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
      ASDCP::Write_EKLV_Packet
                ((FileWriter *)local_1e0,(Dictionary *)&FrameBuf->field_0x10,
                 *(OP1aHeader **)&FrameBuf->field_0x8,
                 (WriterInfo *)((long)&(FrameBuf->m_MIMEType).field_2 + 8),
                 (FrameBuffer *)&FrameBuf[10].field_0x8,(uint *)(FrameBuf[9].m_AssetID + 8),
                 (ulonglong *)&FrameBuf[9].field_0x20,(FrameBuffer *)FrameBuf[9].m_AssetID,
                 (uchar *)Ctx,
                 (uint *)WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.
                         m_Value,(AESEncContext *)&ASDCP::MXF_BER_LENGTH,HMAC);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_1e0);
      Kumu::Result_t::~Result_t((Result_t *)local_1e0);
    }
    *(int *)&FrameBuf[9].field_0x20 = *(int *)&FrameBuf[9].field_0x20 + 1;
    ASDCP::MXF::Partition::~Partition((Partition *)local_158);
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"RESULT_STATE RETURNED at %s (%d)\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
               ,0x259);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFWriter::h__Writer::WriteAncillaryResource(const ASDCP::TimedText::FrameBuffer& FrameBuf,
							       ASDCP::AESEncContext* Ctx, ASDCP::HMACContext* HMAC)
{
  if ( ! m_State.Test_RUNNING() )
    {
      KM_RESULT_STATE_HERE();
      return RESULT_STATE;
    }

  Kumu::fpos_t here = m_File.TellPosition();
  assert(m_Dict);

  // create generic stream partition header
  static UL GenericStream_DataElement(m_Dict->ul(MDD_GenericStream_DataElement));
  ASDCP::MXF::Partition GSPart(m_Dict);

  GSPart.MajorVersion = m_HeaderPart.MajorVersion;
  GSPart.MinorVersion = m_HeaderPart.MinorVersion;
  GSPart.ThisPartition = here;
  GSPart.PreviousPartition = m_RIP.PairArray.back().ByteOffset;
  GSPart.BodySID = m_EssenceStreamID;
  GSPart.OperationalPattern = m_HeaderPart.OperationalPattern;

  m_RIP.PairArray.push_back(RIP::PartitionPair(m_EssenceStreamID++, here));
  GSPart.EssenceContainers = m_HeaderPart.EssenceContainers;
  UL TmpUL(m_Dict->ul(MDD_GenericStreamPartition));
  Result_t result = GSPart.WriteToFile(m_File, TmpUL);

  if ( KM_SUCCESS(result) )
    {
      result = Write_EKLV_Packet(m_File, *m_Dict, m_HeaderPart, m_Info, m_CtFrameBuf, m_FramesWritten,
				 m_StreamOffset, FrameBuf, GenericStream_DataElement.Value(),
				 MXF_BER_LENGTH, Ctx, HMAC);
    }

  m_FramesWritten++;
  return result;
}